

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

void rlSetBlendMode(int mode)

{
  GLenum GVar1;
  GLenum GVar2;
  
  if (RLGL.State.currentBlendMode == mode) {
    return;
  }
  rlDrawRenderBatch(RLGL.currentBatch);
  switch(mode) {
  case 0:
    GVar2 = 0x302;
    goto LAB_0011a574;
  case 1:
    GVar2 = 0x302;
    goto LAB_0011a587;
  case 2:
    GVar2 = 0x306;
LAB_0011a574:
    GVar1 = 0x303;
LAB_0011a58c:
    (*glad_glBlendFunc)(GVar2,GVar1);
    GVar2 = 0x8006;
    break;
  case 3:
    GVar2 = 1;
LAB_0011a587:
    GVar1 = 1;
    goto LAB_0011a58c;
  case 4:
    (*glad_glBlendFunc)(1,1);
    GVar2 = 0x800a;
    break;
  case 5:
    (*glad_glBlendFunc)(RLGL.State.glBlendSrcFactor,RLGL.State.glBlendDstFactor);
    GVar2 = RLGL.State.glad_glBlendEquation;
    break;
  default:
    goto switchD_0011a54f_default;
  }
  (*glad_glBlendEquation)(GVar2);
switchD_0011a54f_default:
  RLGL.State.currentBlendMode = mode;
  return;
}

Assistant:

void rlSetBlendMode(int mode)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    if (RLGL.State.currentBlendMode != mode)
    {
        rlDrawRenderBatch(RLGL.currentBatch);

        switch (mode)
        {
            case BLEND_ALPHA: glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA); glBlendEquation(GL_FUNC_ADD); break;
            case BLEND_ADDITIVE: glBlendFunc(GL_SRC_ALPHA, GL_ONE); glBlendEquation(GL_FUNC_ADD); break;
            case BLEND_MULTIPLIED: glBlendFunc(GL_DST_COLOR, GL_ONE_MINUS_SRC_ALPHA); glBlendEquation(GL_FUNC_ADD); break;
            case BLEND_ADD_COLORS: glBlendFunc(GL_ONE, GL_ONE); glBlendEquation(GL_FUNC_ADD); break;
            case BLEND_SUBTRACT_COLORS: glBlendFunc(GL_ONE, GL_ONE); glBlendEquation(GL_FUNC_SUBTRACT); break;
            case BLEND_CUSTOM: glBlendFunc(RLGL.State.glBlendSrcFactor, RLGL.State.glBlendDstFactor); glBlendEquation(RLGL.State.glBlendEquation); break;
            default: break;
        }

        RLGL.State.currentBlendMode = mode;
    }
#endif
}